

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,ArrayInit *curr)

{
  Module *pMVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  Literal *pLVar8;
  long lVar9;
  long lVar10;
  Name NVar11;
  Name NVar12;
  Field elem;
  undefined1 local_1c8 [32];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_1a8;
  undefined1 local_180 [8];
  Flow ref;
  Flow index;
  Flow offset;
  Flow size;
  shared_ptr<wasm::GCData> data;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_180,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x28));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ref.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x30));
    if (index.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&index.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x38));
      if (offset.breakTo.super_IString.str._M_len == 0) {
        ExpressionRunner<wasm::ModuleRunner>::visit
                  ((Flow *)&offset.breakTo.super_IString.str._M_str,
                   &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x40));
        if (size.breakTo.super_IString.str._M_len == 0) {
          if (((long)((long)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
              3) * -0x5555555555555555 + (long)local_180 != 1) {
LAB_00134368:
            __assert_fail("values.size() == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                          ,0x43,"const Literal &wasm::Flow::getSingleValue()");
          }
          wasm::Literal::getGCData();
          if (size.breakTo.super_IString.str._M_str == (char *)0x0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"null ref");
          }
          if (((ref.breakTo.super_IString.str._M_str +
                ((long)((long)index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
                >> 3) * -0x5555555555555555 != (char *)0x1) ||
              (lVar3 = wasm::Literal::getUnsigned(),
              index.breakTo.super_IString.str._M_str +
              ((long)((long)offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
              >> 3) * -0x5555555555555555 != (char *)0x1)) ||
             (lVar4 = wasm::Literal::getUnsigned(),
             offset.breakTo.super_IString.str._M_str +
             ((long)((long)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start -
                    size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
             3) * -0x5555555555555555 != (char *)0x1)) goto LAB_00134368;
          lVar5 = wasm::Literal::getUnsigned();
          if ((ulong)((*(long *)(size.breakTo.super_IString.str._M_str + 0x30) -
                       *(long *)(size.breakTo.super_IString.str._M_str + 0x28) >> 3) *
                      -0x5555555555555555 + *(long *)(size.breakTo.super_IString.str._M_str + 8)) <
              (ulong)(lVar3 + lVar5)) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds array access in array.init");
          }
          pMVar1 = (this->super_ExpressionRunner<wasm::ModuleRunner>).module;
          if (*(int *)(curr + 0x10) == 1) {
            NVar12.super_IString.str._M_str = *(char **)(curr + 0x18);
            NVar12.super_IString.str._M_len = (size_t)pMVar1;
            lVar6 = wasm::Module::getElementSegment(NVar12);
            if ((ulong)(*(long *)(lVar6 + 0x40) - *(long *)(lVar6 + 0x38) >> 3) <
                (ulong)(lVar4 + lVar5)) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init");
            }
            if (lVar5 != 0) {
              lVar4 = lVar3 * 0x18 + -0x18;
              lVar10 = 0;
              do {
                ExpressionRunner<wasm::ModuleRunner>::visit
                          ((Flow *)local_1c8,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                           *(Expression **)(*(long *)(lVar6 + 0x38) + lVar10 * 8));
                if (((long)local_1a8.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1a8.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                    local_1c8._0_8_ != 1) goto LAB_00134368;
                pLVar8 = (Literal *)(size.breakTo.super_IString.str._M_str + 0x10);
                if (-lVar10 != lVar3) {
                  pLVar8 = (Literal *)
                           (*(long *)(size.breakTo.super_IString.str._M_str + 0x28) + lVar4);
                }
                wasm::Literal::operator=(pLVar8,(Literal *)(local_1c8 + 8));
                std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_1a8);
                wasm::Literal::~Literal((Literal *)(local_1c8 + 8));
                lVar10 = lVar10 + 1;
                lVar4 = lVar4 + 0x18;
              } while (lVar5 != lVar10);
            }
          }
          else {
            if (*(int *)(curr + 0x10) != 0) {
              wasm::handle_unreachable
                        ("unexpected op",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                         ,0xe71);
            }
            NVar11.super_IString.str._M_str = *(char **)(curr + 0x18);
            NVar11.super_IString.str._M_len = (size_t)pMVar1;
            lVar6 = wasm::Module::getDataSegment(NVar11);
            wasm::Type::getHeapType();
            wasm::HeapType::getArray();
            uVar2 = wasm::Field::getByteSize();
            if ((ulong)(*(long *)(lVar6 + 0x40) - *(long *)(lVar6 + 0x38)) <
                lVar5 * (ulong)uVar2 + lVar4) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init_data");
            }
            if ((lVar4 + lVar5 != 0) &&
               (sVar7 = std::
                        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::count(&(this->droppedSegments)._M_h,(key_type *)(curr + 0x18)), sVar7 != 0
               )) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init_data");
            }
            if (lVar5 != 0) {
              lVar10 = lVar3 * 0x18 + -0x18;
              lVar9 = 0;
              do {
                wasm::Literal::makeFromMemory
                          ((Literal *)local_1c8,(Field *)(*(long *)(lVar6 + 0x38) + lVar4));
                pLVar8 = (Literal *)(size.breakTo.super_IString.str._M_str + 0x10);
                if (lVar3 != lVar9) {
                  pLVar8 = (Literal *)
                           (*(long *)(size.breakTo.super_IString.str._M_str + 0x28) + lVar10);
                }
                wasm::Literal::operator=(pLVar8,(Literal *)local_1c8);
                wasm::Literal::~Literal((Literal *)local_1c8);
                lVar9 = lVar9 + -1;
                lVar10 = lVar10 + 0x18;
                lVar4 = lVar4 + (ulong)uVar2;
              } while (-lVar5 != lVar9);
            }
          }
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
          if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
        else {
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
               (size_t)offset.breakTo.super_IString.str._M_str;
          wasm::Literal::Literal
                    ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&size);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish =
               size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish;
          size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
          size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len =
               (size_t)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str =
               (char *)size.breakTo.super_IString.str._M_len;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        wasm::Literal::~Literal((Literal *)&size);
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)index.breakTo.super_IString.str._M_str;
        wasm::Literal::Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems,(Literal *)&offset);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)offset.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      wasm::Literal::~Literal((Literal *)&offset);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)ref.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&index);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)index.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&index);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_180;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ref);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ref.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&ref);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayInit(ArrayInit* curr) {
    NOTE_ENTER("ArrayInit");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    size_t indexVal = index.getSingleValue().getUnsigned();
    size_t offsetVal = offset.getSingleValue().getUnsigned();
    size_t sizeVal = size.getSingleValue().getUnsigned();

    size_t arraySize = data->values.size();
    if ((uint64_t)indexVal + sizeVal > arraySize) {
      trap("out of bounds array access in array.init");
    }

    Module& wasm = *self()->getModule();

    switch (curr->op) {
      case InitData: {
        auto* seg = wasm.getDataSegment(curr->segment);
        auto elem = curr->ref->type.getHeapType().getArray().element;
        size_t elemSize = elem.getByteSize();
        uint64_t readSize = (uint64_t)sizeVal * elemSize;
        if (offsetVal + readSize > seg->data.size()) {
          trap("out of bounds segment access in array.init_data");
        }
        if (offsetVal + sizeVal > 0 && droppedSegments.count(curr->segment)) {
          trap("out of bounds segment access in array.init_data");
        }
        for (size_t i = 0; i < sizeVal; i++) {
          void* addr = (void*)&seg->data[offsetVal + i * elemSize];
          data->values[indexVal + i] = Literal::makeFromMemory(addr, elem);
        }
        return {};
      }
      case InitElem: {
        auto* seg = wasm.getElementSegment(curr->segment);
        if ((uint64_t)offsetVal + sizeVal > seg->data.size()) {
          trap("out of bounds segment access in array.init");
        }
        // TODO: Check whether the segment has been dropped once we support
        // dropping element segments.
        for (size_t i = 0; i < sizeVal; i++) {
          // TODO: This is not correct because it does not preserve the identity
          // of references in the table! ArrayNewSeg suffers the same problem.
          // Fixing it will require changing how we represent segments, at least
          // in the interpreter.
          data->values[indexVal + i] =
            self()->visit(seg->data[i]).getSingleValue();
        }
        return {};
      }
    };
    WASM_UNREACHABLE("unexpected op");
  }